

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

void __thiscall cfd::core::SigHashType::SigHashType(SigHashType *this,SigHashType *sighash_type)

{
  SigHashType *sighash_type_local;
  SigHashType *this_local;
  
  this->kSigHashForkId = '@';
  this->kSigHashRangeproof = '@';
  this->kSigHashAnyOneCanPay = 0x80;
  this->hash_algorithm_ = sighash_type->hash_algorithm_;
  this->is_anyone_can_pay_ = (bool)(sighash_type->is_anyone_can_pay_ & 1);
  this->is_fork_id_ = (bool)(sighash_type->is_fork_id_ & 1);
  return;
}

Assistant:

SigHashType::SigHashType(const SigHashType &sighash_type) {
  hash_algorithm_ = sighash_type.hash_algorithm_;
  is_anyone_can_pay_ = sighash_type.is_anyone_can_pay_;
  is_fork_id_ = sighash_type.is_fork_id_;
}